

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

QObject * qt_qFindChild_helper
                    (QObject *parent,QAnyStringView name,QMetaObject *mo,FindChildOptions options)

{
  long lVar1;
  QAnyStringView name_00;
  QAnyStringView name_01;
  bool bVar2;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 mo_00;
  const_iterator cVar3;
  QObject **ppQVar4;
  QObject *pQVar5;
  const_iterator o;
  QObject *in_RCX;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RSI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  QObject *obj_1;
  QObject *child;
  QObjectList *__range2;
  QObject *obj;
  QObjectList *__range1;
  const_iterator __end2;
  const_iterator __begin2;
  const_iterator __end1;
  const_iterator __begin1;
  QObject *in_stack_ffffffffffffff38;
  QObject *in_stack_ffffffffffffff40;
  QObject *local_88;
  const_iterator local_58;
  QFlagsStorageHelper<Qt::FindChildOption,_4> local_4c;
  QObject **local_38;
  const_iterator local_30;
  undefined4 in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  mo_00.m_data = QObject::children((QObject *)0x3ef167);
  cVar3 = QList<QObject_*>::begin((QList<QObject_*> *)in_stack_ffffffffffffff40);
  local_30.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = QList<QObject_*>::end((QList<QObject_*> *)in_stack_ffffffffffffff40);
  while( true ) {
    local_38 = local_30.i;
    bVar2 = QList<QObject_*>::const_iterator::operator!=
                      ((const_iterator *)&stack0xffffffffffffffd8,local_30);
    if (!bVar2) break;
    ppQVar4 = QList<QObject_*>::const_iterator::operator*
                        ((const_iterator *)&stack0xffffffffffffffd8);
    local_88 = *ppQVar4;
    pQVar5 = QMetaObject::cast((QMetaObject *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if ((pQVar5 != (QObject *)0x0) &&
       ((bVar2 = QAnyStringView::isNull((QAnyStringView *)&stack0xffffffffffffffe8), bVar2 ||
        (name_00.m_size = (size_t)in_RCX, name_00.field_0.m_data = mo_00.m_data,
        bVar2 = matches_objectName_non_null(in_stack_ffffffffffffff40,name_00), bVar2))))
    goto LAB_003ef3a0;
    QList<QObject_*>::const_iterator::operator++((const_iterator *)&stack0xffffffffffffffd8);
  }
  local_4c.super_QFlagsStorage<Qt::FindChildOption>.i =
       (QFlagsStorage<Qt::FindChildOption>)
       QFlags<Qt::FindChildOption>::operator&
                 ((QFlags<Qt::FindChildOption> *)in_stack_ffffffffffffff40,
                  (FindChildOption)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  bVar2 = QFlags::operator_cast_to_bool((QFlags *)&local_4c);
  if (bVar2) {
    QObject::children((QObject *)0x3ef2bc);
    local_58.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = QList<QObject_*>::begin((QList<QObject_*> *)in_stack_ffffffffffffff40);
    o = QList<QObject_*>::end((QList<QObject_*> *)in_stack_ffffffffffffff40);
    while (bVar2 = QList<QObject_*>::const_iterator::operator!=(&local_58,o), bVar2) {
      QList<QObject_*>::const_iterator::operator*(&local_58);
      name_01.field_0._4_4_ = in_R8D;
      name_01.field_0._0_4_ = in_stack_ffffffffffffffe0;
      name_01.m_size = (size_t)in_RSI.m_data;
      local_88 = qt_qFindChild_helper
                           (in_RCX,name_01,(QMetaObject *)mo_00.m_data,
                            (QFlagsStorageHelper<Qt::FindChildOption,_4>)
                            SUB84((ulong)cVar3.i >> 0x20,0));
      if (local_88 != (QObject *)0x0) goto LAB_003ef3a0;
      QList<QObject_*>::const_iterator::operator++(&local_58);
    }
  }
  local_88 = (QObject *)0x0;
LAB_003ef3a0:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_88;
}

Assistant:

QObject *qt_qFindChild_helper(const QObject *parent, QAnyStringView name, const QMetaObject &mo, Qt::FindChildOptions options)
{
    Q_ASSERT(parent);
    for (QObject *obj : parent->children()) {
        if (mo.cast(obj) && (name.isNull() || matches_objectName_non_null(obj, name)))
           return obj;
    }
    if (options & Qt::FindChildrenRecursively) {
        for (QObject *child : parent->children()) {
            if (QObject *obj = qt_qFindChild_helper(child, name, mo, options))
                return obj;
        }
    }
    return nullptr;
}